

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.hpp
# Opt level: O2

void __thiscall
crsGA::Logger::log_recursive(Logger *this,LogLevel logLevel,char *file,int line,ostringstream *msg)

{
  double __x;
  string asStack_48 [32];
  
  __x = (double)std::__cxx11::stringbuf::str();
  log(this,__x);
  std::__cxx11::string::~string(asStack_48);
  return;
}

Assistant:

void log_recursive(LogLevel logLevel, const char* file, int line, std::ostringstream& msg)
        {
            log(logLevel, file, line, msg.str());
        }